

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<kj::(anonymous_namespace)::AppendableFileImpl>::~Own
          (Own<kj::(anonymous_namespace)::AppendableFileImpl> *this)

{
  AppendableFileImpl *pAVar1;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (AppendableFileImpl *)0x0) {
    this->ptr = (AppendableFileImpl *)0x0;
    (**this->disposer->_vptr_Disposer)
              (this->disposer,
               (pAVar1->super_AppendableFile).super_FsNode._vptr_FsNode[-2] +
               (long)&(pAVar1->super_AppendableFile).super_FsNode._vptr_FsNode);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }